

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluxBoxes.cpp
# Opt level: O0

MultiFab ** __thiscall FluxBoxes::define(FluxBoxes *this,AmrLevel *amr_level,int nvar,int nghost)

{
  element_type *peVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  AmrLevel *in_RSI;
  DistributionMapping *in_RDI;
  DistributionMapping *dm;
  BoxArray *ba;
  int dir;
  FabFactory<amrex::FArrayBox> *in_stack_ffffffffffffff58;
  AmrLevel *in_stack_ffffffffffffff60;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined8 *puVar4;
  uint in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  MultiFab *in_stack_ffffffffffffffa0;
  undefined8 local_58;
  FabFactory<amrex::FArrayBox> *factory;
  int local_1c;
  
  peVar1 = (element_type *)operator_new__(0x18);
  (in_RDI->m_ref).super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar1;
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    amrex::AmrLevel::getEdgeBoxArray
              (in_stack_ffffffffffffff60,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    amrex::AmrLevel::DistributionMap(in_RSI);
    in_stack_ffffffffffffff60 = (AmrLevel *)operator_new(0x180);
    in_stack_ffffffffffffff98 = CONCAT13(1,(int3)in_stack_ffffffffffffff98);
    local_58 = 0;
    factory = (FabFactory<amrex::FArrayBox> *)0x0;
    puVar4 = &local_58;
    uVar2 = in_EDX;
    uVar3 = in_ECX;
    amrex::MFInfo::MFInfo((MFInfo *)0x7b0e39);
    in_stack_ffffffffffffff58 = amrex::AmrLevel::Factory(in_stack_ffffffffffffff60);
    amrex::MultiFab::MultiFab
              (in_stack_ffffffffffffffa0,
               (BoxArray *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),in_RDI,
               (int)((ulong)puVar4 >> 0x20),(int)puVar4,(MFInfo *)CONCAT44(uVar3,uVar2),factory);
    in_stack_ffffffffffffff98 = in_stack_ffffffffffffff98 & 0xffffff;
    *(AmrLevel **)
     ((long)&(((in_RDI->m_ref).
               super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->m_pmap).super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl + (long)local_1c * 8) =
         in_stack_ffffffffffffff60;
    amrex::MFInfo::~MFInfo((MFInfo *)0x7b0e9b);
  }
  return (MultiFab **)
         (in_RDI->m_ref).
         super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
}

Assistant:

MultiFab**
FluxBoxes::define (const AmrLevel* amr_level, int nvar, int nghost)
{
    BL_ASSERT(data == 0);
    data = new MultiFab*[BL_SPACEDIM];
    for (int dir = 0; dir < BL_SPACEDIM; dir++)
    {
	const BoxArray& ba = amr_level->getEdgeBoxArray(dir);
        const DistributionMapping& dm = amr_level->DistributionMap();
        data[dir] = new MultiFab(ba,dm,nvar,nghost,MFInfo(),amr_level->Factory());
    }
    return data;
}